

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_buffer.cpp
# Opt level: O0

int __thiscall libtorrent::aux::packet_buffer::remove(packet_buffer *this,char *__filename)

{
  bool bVar1;
  uint uVar2;
  unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *puVar3;
  unique_ptr *puVar4;
  uint in_EDX;
  uint local_44;
  uint local_40;
  index_type i_1;
  index_type i;
  size_t mask;
  index_type idx_local;
  packet_buffer *this_local;
  packet_ptr *old_value;
  
  if (in_EDX < (uint)(*(int *)(__filename + 0x10) + *(int *)(__filename + 8))) {
    bVar1 = compare_less_wrap(in_EDX,*(uint32_t *)(__filename + 0x10),0xffff);
    if (bVar1) {
      ::std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>::
      unique_ptr<libtorrent::aux::packet_deleter,void>
                ((unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter> *)this);
    }
    else {
      uVar2 = *(int *)(__filename + 8) - 1;
      puVar3 = unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_unsigned_int>
               ::operator[]((unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_unsigned_int>
                             *)__filename,in_EDX & uVar2);
      ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::unique_ptr
                ((unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)this,puVar3
                );
      puVar3 = unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_unsigned_int>
               ::operator[]((unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_unsigned_int>
                             *)__filename,in_EDX & uVar2);
      ::std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>::reset
                (puVar3,(pointer)0x0);
      bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
      if ((bVar1) &&
         (*(int *)(__filename + 0xc) = *(int *)(__filename + 0xc) + -1,
         *(int *)(__filename + 0xc) == 0)) {
        *(undefined4 *)(__filename + 0x14) = *(undefined4 *)(__filename + 0x10);
      }
      if ((in_EDX == *(uint *)(__filename + 0x10)) && (*(int *)(__filename + 0xc) != 0)) {
        *(int *)(__filename + 0x10) = *(int *)(__filename + 0x10) + 1;
        local_40 = 0;
        while (local_40 < *(uint *)(__filename + 8)) {
          puVar4 = (unique_ptr *)
                   unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_unsigned_int>
                   ::operator[]((unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_unsigned_int>
                                 *)__filename,*(uint *)(__filename + 0x10) & uVar2);
          bVar1 = ::std::unique_ptr::operator_cast_to_bool(puVar4);
          if (bVar1) break;
          local_40 = local_40 + 1;
          *(int *)(__filename + 0x10) = *(int *)(__filename + 0x10) + 1;
        }
        *(uint *)(__filename + 0x10) = *(uint *)(__filename + 0x10) & 0xffff;
      }
      if (((in_EDX + 1 & 0xffff) == *(uint *)(__filename + 0x14)) &&
         (*(int *)(__filename + 0xc) != 0)) {
        *(int *)(__filename + 0x14) = *(int *)(__filename + 0x14) + -1;
        local_44 = 0;
        while (local_44 < *(uint *)(__filename + 8)) {
          puVar4 = (unique_ptr *)
                   unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_unsigned_int>
                   ::operator[]((unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_unsigned_int>
                                 *)__filename,*(uint *)(__filename + 0x14) & uVar2);
          bVar1 = ::std::unique_ptr::operator_cast_to_bool(puVar4);
          if (bVar1) break;
          local_44 = local_44 + 1;
          *(int *)(__filename + 0x14) = *(int *)(__filename + 0x14) + -1;
        }
        *(int *)(__filename + 0x14) = *(int *)(__filename + 0x14) + 1;
        *(uint *)(__filename + 0x14) = *(uint *)(__filename + 0x14) & 0xffff;
      }
    }
  }
  else {
    ::std::unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter>::
    unique_ptr<libtorrent::aux::packet_deleter,void>
              ((unique_ptr<libtorrent::aux::packet,libtorrent::aux::packet_deleter> *)this);
  }
  return (int)this;
}

Assistant:

packet_ptr packet_buffer::remove(index_type idx)
	{
		INVARIANT_CHECK;
		// TODO: use compare_less_wrap for this comparison as well
		if (idx >= m_first + m_capacity)
			return packet_ptr();

		if (compare_less_wrap(idx, m_first, 0xffff))
			return packet_ptr();

		std::size_t const mask = m_capacity - 1;
		packet_ptr old_value = std::move(m_storage[idx & mask]);
		m_storage[idx & mask].reset();

		if (old_value)
		{
			--m_size;
			if (m_size == 0) m_last = m_first;
		}

		if (idx == m_first && m_size != 0)
		{
			++m_first;
			for (index_type i = 0; i < m_capacity; ++i, ++m_first)
				if (m_storage[m_first & mask]) break;
			m_first &= 0xffff;
		}

		if (((idx + 1) & 0xffff) == m_last && m_size != 0)
		{
			--m_last;
			for (index_type i = 0; i < m_capacity; ++i, --m_last)
				if (m_storage[m_last & mask]) break;
			++m_last;
			m_last &= 0xffff;
		}

		TORRENT_ASSERT_VAL(m_first <= 0xffff, m_first);
		return old_value;
	}